

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void SerializeMany<ParamsStream<AutoFile&,TransactionSerParams>,COutPoint,CScript,unsigned_int>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *s,COutPoint *args,CScript *args_1,
               uint *args_2)

{
  uint *__n;
  long in_FS_OFFSET;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __n = args_2;
  COutPoint::
  SerializationOps<ParamsStream<AutoFile&,TransactionSerParams>,COutPoint_const,ActionSerialize>
            (args,s);
  SerializeMany<ParamsStream<AutoFile&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
            (s,&args_1->super_CScriptBase);
  local_24 = *args_2;
  AutoFile::write(s->m_substream,(int)&local_24,(void *)0x4,(size_t)__n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}